

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O2

int string_to_parts(char *format,char *str,int *year,int *month,int *day,int *hour,int *minute,
                   int *second,int *musec)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int day_of_year;
  
  *year = 2000;
  *month = 1;
  *day = 1;
  *hour = 0;
  *minute = 0;
  *second = 0;
  *musec = 0;
  lVar8 = 0;
  iVar6 = 0;
  bVar1 = false;
LAB_0012dbd0:
  cVar2 = format[(int)lVar8];
  lVar9 = (long)(int)lVar8;
  do {
    lVar8 = lVar9 + 1;
    if (cVar2 == '\0') {
      if (bVar1) {
        pcVar5 = "missing closing \' in date/time format (%s)";
        goto LAB_0012dfd8;
      }
LAB_0012dfe7:
      if (str[iVar6] == '\0') {
        return 0;
      }
      pcVar5 = "date/time argument (%s) contains additional characters (format: %s)";
      goto LAB_0012dff5;
    }
    if ((!bVar1) && (cVar2 == '|')) goto LAB_0012dfe7;
    if ((cVar2 != '\'') || (cVar2 = format[lVar8], lVar9 = lVar8, cVar2 == '\'')) break;
    bVar1 = (bool)(bVar1 ^ 1);
  } while( true );
  lVar8 = (long)(int)lVar9;
  cVar2 = format[lVar8];
  if (bVar1) {
LAB_0012dc10:
    if (cVar2 != str[iVar6]) {
      pcVar5 = "date/time argument (%s) has an incorrect fixed character (format: %s)";
      goto LAB_0012dff5;
    }
    lVar8 = lVar9 + 1;
    iVar6 = iVar6 + 1;
    goto LAB_0012dbd0;
  }
  if (cVar2 == 'D') {
    if ((format[lVar8 + 1] == 'D') && (format[lVar8 + 2] == 'D')) {
      iVar3 = parse_integer(str + iVar6,3,(uint)(format[lVar8 + 3] == '*'),&day_of_year);
      if (iVar3 == 0) {
        iVar3 = coda_dayofyear_to_month_day(*year,day_of_year,month,day);
        if (iVar3 != 0) {
          pcVar5 = "date/time argument (%s) has an invalid day value (format: %s)";
          goto LAB_0012dff5;
        }
        lVar8 = (ulong)(format[lVar8 + 3] == '*') + lVar9 + 3;
        iVar6 = iVar6 + 3;
        goto LAB_0012dbd0;
      }
LAB_0012e02d:
      pcVar5 = "date/time argument (%s) has an incorrect day value (format: %s)";
      goto LAB_0012dff5;
    }
  }
  else if (cVar2 == 'H') {
    if (format[lVar8 + 1] == 'H') {
      iVar3 = parse_integer(str + iVar6,2,(uint)(format[lVar8 + 2] == '*'),hour);
      if (iVar3 != 0) {
        pcVar5 = "date/time argument (%s) has an incorrect hour value (format: %s)";
        goto LAB_0012dff5;
      }
LAB_0012df96:
      lVar8 = (ulong)(format[lVar8 + 2] == '*') + lVar9 + 2;
      iVar6 = iVar6 + 2;
      goto LAB_0012dbd0;
    }
  }
  else if (cVar2 == 'M') {
    if (format[lVar8 + 1] == 'M') {
      if (format[lVar8 + 2] == 'M') {
        iVar3 = coda_month_to_integer(str + iVar6);
        *month = iVar3;
        if (iVar3 == -1) goto LAB_0012e03f;
        lVar8 = lVar9 + 3;
        iVar6 = iVar6 + 3;
        goto LAB_0012dbd0;
      }
      iVar3 = parse_integer(str + iVar6,2,(uint)(format[lVar8 + 2] == '*'),month);
      if (iVar3 != 0) {
LAB_0012e03f:
        pcVar5 = "date/time argument (%s) has an incorrect month value (format: %s)";
LAB_0012dff5:
        coda_set_error(-0x68,pcVar5,str,format);
        return -1;
      }
      goto LAB_0012df96;
    }
  }
  else {
    if (cVar2 == 'y') {
      if (((format[lVar8 + 1] == 'y') && (format[lVar8 + 2] == 'y')) && (format[lVar8 + 3] == 'y'))
      {
        iVar3 = parse_integer(str + iVar6,4,(uint)(format[lVar8 + 4] == '*'),year);
        if (iVar3 != 0) {
          pcVar5 = "date/time argument (%s) has an incorrect year value (format: %s)";
          goto LAB_0012dff5;
        }
        lVar8 = (ulong)(format[lVar8] == '*') + lVar9 + 4;
        iVar6 = iVar6 + 4;
        goto LAB_0012dbd0;
      }
    }
    else if (cVar2 == 'd') {
      if (format[lVar8 + 1] == 'd') {
        iVar3 = parse_integer(str + iVar6,2,(uint)(format[lVar8 + 2] == '*'),day);
        if (iVar3 != 0) goto LAB_0012e02d;
        goto LAB_0012df96;
      }
    }
    else if (cVar2 == 'm') {
      if (format[lVar8 + 1] == 'm') {
        iVar3 = parse_integer(str + iVar6,2,(uint)(format[lVar8 + 2] == '*'),minute);
        if (iVar3 != 0) {
          pcVar5 = "date/time argument (%s) has an incorrect minute value (format: %s)";
          goto LAB_0012dff5;
        }
        goto LAB_0012df96;
      }
    }
    else if (cVar2 == 's') {
      if (format[lVar8 + 1] == 's') {
        iVar3 = parse_integer(str + iVar6,2,(uint)(format[lVar8 + 2] == '*'),second);
        if (iVar3 != 0) {
          pcVar5 = "date/time argument (%s) has an incorrect second value (format: %s)";
          goto LAB_0012dff5;
        }
        goto LAB_0012df96;
      }
    }
    else {
      if (cVar2 == 'S') {
        uVar7 = 0;
        cVar2 = 'S';
        while (cVar2 == 'S') {
          uVar7 = uVar7 + 1;
          lVar9 = lVar8 + 1;
          lVar8 = lVar8 + 1;
          cVar2 = format[lVar9];
        }
        uVar4 = 6;
        if (uVar7 < 6) {
          uVar4 = uVar7;
        }
        iVar3 = parse_integer(str + iVar6,uVar4,0,musec);
        uVar4 = uVar7;
        if (iVar3 != 0) {
          pcVar5 = "date/time argument (%s) has an incorrect fractional second value (format: %s)";
          goto LAB_0012dff5;
        }
        for (; uVar4 < 6; uVar4 = uVar4 + 1) {
          *musec = *musec * 10;
        }
        iVar6 = iVar6 + uVar7;
        goto LAB_0012dbd0;
      }
      if ((byte)(cVar2 + 0xbfU) < 0x1a) goto LAB_0012e024;
    }
    if ((cVar2 != '*') && (0x19 < (byte)(cVar2 + 0x9fU))) goto LAB_0012dc10;
  }
LAB_0012e024:
  pcVar5 = "unsuppored character sequence in date/time format (%s)";
LAB_0012dfd8:
  coda_set_error(-0x67,pcVar5,format);
  return -1;
}

Assistant:

static int string_to_parts(const char *format, const char *str, int *year, int *month, int *day, int *hour,
                           int *minute, int *second, int *musec)
{
    int use_leading_spaces;
    int format_index = 0;
    int string_index = 0;
    int literal = 0;
    int n;

    /* initialize with epoch 2000-01-01T00:00:00.000000 */
    *year = 2000;
    *month = 1;
    *day = 1;
    *hour = 0;
    *minute = 0;
    *second = 0;
    *musec = 0;

    while (format[format_index] != '\0' && (literal || format[format_index] != '|'))
    {
        if (format[format_index] == '\'')
        {
            format_index++;
            if (format[format_index] != '\'')
            {
                literal = !literal;
                continue;
            }
        }
        if (literal)
        {
            /* literal match */
            if (format[format_index] != str[string_index])
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fixed character "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index++;
            string_index++;
        }
        else if (format[format_index] == 'y' && format[format_index + 1] == 'y' && format[format_index + 2] == 'y' &&
                 format[format_index + 3] == 'y')
        {
            use_leading_spaces = format[format_index + 4] == '*';
            if (parse_integer(&str[string_index], 4, use_leading_spaces, year) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect year value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 4 + (format[format_index] == '*');
            string_index += 4;
        }
        else if (format[format_index] == 'M' && format[format_index + 1] == 'M')
        {
            if (format[format_index + 2] == 'M')
            {
                /* coda_month_to_integer already limits comparison to only 3 characters */
                *month = coda_month_to_integer(&str[string_index]);
                if (*month == -1)
                {
                    coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect month value "
                                   "(format: %s)", str, format);
                    return -1;
                }
                format_index += 3;
                string_index += 3;
            }
            else
            {
                use_leading_spaces = format[format_index + 2] == '*';
                if (parse_integer(&str[string_index], 2, use_leading_spaces, month) != 0)
                {
                    coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect month value "
                                   "(format: %s)", str, format);
                    return -1;
                }
                format_index += 2 + (format[format_index + 2] == '*');
                string_index += 2;
            }
        }
        else if (format[format_index] == 'd' && format[format_index + 1] == 'd')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, day) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect day value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'D' && format[format_index + 1] == 'D' && format[format_index + 2] == 'D')
        {
            int day_of_year;

            use_leading_spaces = format[format_index + 3] == '*';
            /* uses currently parsed year value to determine the actual month/day within the year */
            if (parse_integer(&str[string_index], 3, use_leading_spaces, &day_of_year) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect day value "
                               "(format: %s)", str, format);
                return -1;
            }
            if (coda_dayofyear_to_month_day(*year, day_of_year, month, day) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an invalid day value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 3 + (format[format_index + 3] == '*');
            string_index += 3;
        }
        else if (format[format_index] == 'H' && format[format_index + 1] == 'H')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, hour) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect hour value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'm' && format[format_index + 1] == 'm')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, minute) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect minute value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 's' && format[format_index + 1] == 's')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, second) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect second value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'S')
        {
            n = 0;
            while (format[format_index] == 'S')
            {
                format_index++;
                n++;
            }
            if (parse_integer(&str[string_index], n > 6 ? 6 : n, 0, musec) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fractional "
                               "second value (format: %s)", str, format);
                return -1;
            }
            string_index += n;
            while (n < 6)
            {
                *musec *= 10;
                n++;
            }
        }
        else if ((format[format_index] >= 'A' && format[format_index] <= 'Z') ||
                 (format[format_index] >= 'a' && format[format_index] <= 'z') || format[format_index] == '*')
        {
            /* reserved character */
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "unsuppored character sequence in date/time format (%s)", format);
            return -1;
        }
        else
        {
            /* literal match */
            if (format[format_index] != str[string_index])
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fixed character "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index++;
            string_index++;
        }
    }
    if (literal)
    {
        coda_set_error(CODA_ERROR_INVALID_FORMAT, "missing closing ' in date/time format (%s)", format);
        return -1;
    }
    if (str[string_index] != '\0')
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) contains additional characters "
                       "(format: %s)", str, format);
        return -1;
    }

    return 0;
}